

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

xmlRegexpPtr xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegStatePtr pxVar3;
  xmlRegTrans *pxVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  xmlRegexpPtr comp;
  void *pvVar8;
  long lVar9;
  xmlChar **ppxVar10;
  void *pvVar11;
  xmlChar *pxVar12;
  int *piVar13;
  void **ppvVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  
  comp = (xmlRegexpPtr)(*xmlMalloc)(0x68);
  if (comp == (xmlRegexpPtr)0x0) {
    xmlRegexpErrMemory(ctxt,"compiling regexp");
    return (xmlRegexpPtr)0x0;
  }
  comp->transdata = (void **)0x0;
  *(undefined8 *)&comp->nbstrings = 0;
  *(undefined8 *)&comp->nbstates = 0;
  comp->compact = (int *)0x0;
  comp->counters = (xmlRegCounter *)0x0;
  comp->determinist = 0;
  comp->flags = 0;
  comp->atoms = (xmlRegAtomPtr *)0x0;
  *(undefined8 *)&comp->nbCounters = 0;
  comp->states = (xmlRegStatePtr *)0x0;
  *(undefined8 *)&comp->nbAtoms = 0;
  comp->stringMap = (xmlChar **)0x0;
  comp->string = (xmlChar *)0x0;
  *(undefined8 *)&comp->nbStates = 0;
  comp->string = ctxt->string;
  comp->nbStates = ctxt->nbStates;
  comp->states = ctxt->states;
  comp->nbAtoms = ctxt->nbAtoms;
  comp->atoms = ctxt->atoms;
  comp->nbCounters = ctxt->nbCounters;
  comp->counters = ctxt->counters;
  iVar6 = ctxt->determinist;
  comp->determinist = iVar6;
  comp->flags = ctxt->flags;
  if (iVar6 == -1) {
    xmlRegexpIsDeterminist(comp);
    iVar6 = comp->determinist;
  }
  if (((((iVar6 == 0) || (comp->nbCounters != 0)) || (ctxt->negs != 0)) ||
      ((comp->atoms == (xmlRegAtomPtr *)0x0 || (pxVar2 = *comp->atoms, pxVar2 == (xmlRegAtomPtr)0x0)
       ))) || (pxVar2->type != XML_REGEXP_STRING)) {
LAB_001a157f:
    ctxt->string = (xmlChar *)0x0;
    ctxt->nbStates = 0;
    ctxt->states = (xmlRegStatePtr *)0x0;
    ctxt->nbAtoms = 0;
    ctxt->atoms = (xmlRegAtomPtr *)0x0;
    ctxt->nbCounters = 0;
    ctxt->counters = (xmlRegCounter *)0x0;
    return comp;
  }
  pvVar8 = (*xmlMalloc)((long)comp->nbStates << 2);
  if (pvVar8 == (void *)0x0) {
    xmlRegexpErrMemory(ctxt,"compiling regexp");
    (*xmlFree)(comp);
    return (xmlRegexpPtr)0x0;
  }
  uVar16 = 0;
  for (lVar9 = 0; lVar9 < comp->nbStates; lVar9 = lVar9 + 1) {
    pxVar3 = comp->states[lVar9];
    *(uint *)((long)pvVar8 + lVar9 * 4) = -(uint)(pxVar3 == (xmlRegStatePtr)0x0) | uVar16;
    uVar16 = (uVar16 + 1) - (uint)(pxVar3 == (xmlRegStatePtr)0x0);
  }
  ppxVar10 = (xmlChar **)(*xmlMalloc)((long)comp->nbAtoms << 3);
  if (ppxVar10 == (xmlChar **)0x0) {
    xmlRegexpErrMemory(ctxt,"compiling regexp");
  }
  else {
    pvVar11 = (*xmlMalloc)((long)comp->nbAtoms << 2);
    if (pvVar11 != (void *)0x0) {
      uVar18 = 0;
      for (lVar9 = 0; lVar9 < comp->nbAtoms; lVar9 = lVar9 + 1) {
        pxVar2 = comp->atoms[lVar9];
        if ((pxVar2->type != XML_REGEXP_STRING) || (pxVar2->quant != XML_REGEXP_QUANT_ONCE)) {
          (*xmlFree)(pvVar8);
          (*xmlFree)(pvVar11);
          uVar19 = 0;
          uVar22 = (ulong)uVar18;
          if ((int)uVar18 < 1) {
            uVar22 = uVar19;
          }
          for (; uVar22 != uVar19; uVar19 = uVar19 + 1) {
            (*xmlFree)(ppxVar10[uVar19]);
          }
          goto LAB_001a1a48;
        }
        pxVar12 = (xmlChar *)pxVar2->valuep;
        uVar22 = 0;
        if (0 < (int)uVar18) {
          uVar22 = (ulong)uVar18;
        }
        for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
          iVar6 = xmlStrEqual(ppxVar10[uVar19],pxVar12);
          if (iVar6 != 0) {
            *(int *)((long)pvVar11 + lVar9 * 4) = (int)uVar19;
            goto LAB_001a1730;
          }
        }
        *(uint *)((long)pvVar11 + lVar9 * 4) = uVar18;
        pxVar12 = xmlStrdup(pxVar12);
        ppxVar10[(int)uVar18] = pxVar12;
        if (pxVar12 == (xmlChar *)0x0) {
          uVar19 = 0;
          uVar22 = (ulong)uVar18;
          if ((int)uVar18 < 1) {
            uVar22 = uVar19;
          }
          for (; uVar22 != uVar19; uVar19 = uVar19 + 1) {
            (*xmlFree)(ppxVar10[uVar19]);
          }
          (*xmlFree)(pvVar11);
          (*xmlFree)(ppxVar10);
          goto LAB_001a1791;
        }
        uVar18 = uVar18 + 1;
LAB_001a1730:
      }
      piVar13 = (int *)xmlRegCalloc2((ulong)(uVar16 + 1),(long)(int)(uVar18 + 1),4);
      if (piVar13 != (int *)0x0) {
        ppvVar14 = (void **)0x0;
        for (lVar9 = 0; uVar22 = (ulong)comp->nbStates, lVar9 < (long)uVar22; lVar9 = lVar9 + 1) {
          iVar6 = *(int *)((long)pvVar8 + lVar9 * 4);
          if (iVar6 != -1) {
            pxVar3 = comp->states[lVar9];
            iVar17 = iVar6 * (uVar18 + 1);
            piVar13[iVar17] = pxVar3->type;
            lVar20 = 8;
            for (lVar21 = 0; lVar21 < pxVar3->nbTrans; lVar21 = lVar21 + 1) {
              pxVar4 = pxVar3->trans;
              iVar7 = *(int *)((long)&pxVar4->atom + lVar20);
              if ((iVar7 != -1) &&
                 (piVar5 = *(int **)((long)pxVar4 + lVar20 + -8), piVar5 != (int *)0x0)) {
                iVar1 = *(int *)((long)pvVar11 + (long)*piVar5 * 4);
                if ((*(long *)(piVar5 + 0x16) != 0) && (ppvVar14 == (void **)0x0)) {
                  ppvVar14 = (void **)xmlRegCalloc2((ulong)uVar16,(long)(int)uVar18,8);
                  if (ppvVar14 == (void **)0x0) {
                    xmlRegexpErrMemory(ctxt,"compiling regexp");
                    ppvVar14 = (void **)0x0;
                    break;
                  }
                  iVar7 = *(int *)((long)&pxVar4->atom + lVar20);
                }
                lVar15 = (long)(iVar1 + iVar17);
                iVar7 = *(int *)((long)pvVar8 + (long)iVar7 * 4) + 1;
                if (piVar13[lVar15 + 1] == 0) {
                  piVar13[lVar15 + 1] = iVar7;
                  if (ppvVar14 == (void **)0x0) {
                    ppvVar14 = (void **)0x0;
                  }
                  else {
                    ppvVar14[(int)(iVar1 + iVar6 * uVar18)] =
                         *(void **)(*(long *)((long)pxVar4 + lVar20 + -8) + 0x58);
                  }
                }
                else if (piVar13[lVar15 + 1] != iVar7) {
                  comp->determinist = 0;
                  if (ppvVar14 != (void **)0x0) {
                    (*xmlFree)(ppvVar14);
                  }
                  (*xmlFree)(piVar13);
                  (*xmlFree)(pvVar8);
                  (*xmlFree)(pvVar11);
                  uVar19 = 0;
                  uVar22 = (ulong)uVar18;
                  if ((int)uVar18 < 1) {
                    uVar22 = uVar19;
                  }
                  for (; uVar22 != uVar19; uVar19 = uVar19 + 1) {
                    (*xmlFree)(ppxVar10[uVar19]);
                  }
                  (*xmlFree)(ppxVar10);
                  goto LAB_001a157f;
                }
              }
              lVar20 = lVar20 + 0x18;
            }
          }
        }
        comp->determinist = 1;
        if (comp->states != (xmlRegStatePtr *)0x0) {
          for (lVar9 = 0; lVar9 < (int)uVar22; lVar9 = lVar9 + 1) {
            xmlRegFreeState(comp->states[lVar9]);
            uVar22 = (ulong)(uint)comp->nbStates;
          }
          (*xmlFree)(comp->states);
        }
        comp->states = (xmlRegStatePtr *)0x0;
        comp->nbStates = 0;
        if (comp->atoms != (xmlRegAtomPtr *)0x0) {
          for (lVar9 = 0; lVar9 < comp->nbAtoms; lVar9 = lVar9 + 1) {
            xmlRegFreeAtom(comp->atoms[lVar9]);
          }
          (*xmlFree)(comp->atoms);
        }
        comp->atoms = (xmlRegAtomPtr *)0x0;
        comp->nbAtoms = 0;
        comp->compact = piVar13;
        comp->transdata = ppvVar14;
        comp->stringMap = ppxVar10;
        comp->nbstrings = uVar18;
        comp->nbstates = uVar16;
        (*xmlFree)(pvVar8);
        (*xmlFree)(pvVar11);
        goto LAB_001a157f;
      }
      (*xmlFree)(pvVar8);
      (*xmlFree)(pvVar11);
      uVar19 = 0;
      uVar22 = (ulong)uVar18;
      if ((int)uVar18 < 1) {
        uVar22 = uVar19;
      }
      for (; uVar22 != uVar19; uVar19 = uVar19 + 1) {
        (*xmlFree)(ppxVar10[uVar19]);
      }
LAB_001a1a48:
      (*xmlFree)(ppxVar10);
      goto LAB_001a1a4f;
    }
    xmlRegexpErrMemory(ctxt,"compiling regexp");
    (*xmlFree)(ppxVar10);
  }
LAB_001a1791:
  (*xmlFree)(pvVar8);
LAB_001a1a4f:
  (*xmlFree)(comp);
  return (xmlRegexpPtr)0x0;
}

Assistant:

static xmlRegexpPtr
xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt) {
    xmlRegexpPtr ret;

    ret = (xmlRegexpPtr) xmlMalloc(sizeof(xmlRegexp));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt, "compiling regexp");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegexp));
    ret->string = ctxt->string;
    ret->nbStates = ctxt->nbStates;
    ret->states = ctxt->states;
    ret->nbAtoms = ctxt->nbAtoms;
    ret->atoms = ctxt->atoms;
    ret->nbCounters = ctxt->nbCounters;
    ret->counters = ctxt->counters;
    ret->determinist = ctxt->determinist;
    ret->flags = ctxt->flags;
    if (ret->determinist == -1) {
        xmlRegexpIsDeterminist(ret);
    }

    if ((ret->determinist != 0) &&
	(ret->nbCounters == 0) &&
	(ctxt->negs == 0) &&
	(ret->atoms != NULL) &&
	(ret->atoms[0] != NULL) &&
	(ret->atoms[0]->type == XML_REGEXP_STRING)) {
	int i, j, nbstates = 0, nbatoms = 0;
	int *stateRemap;
	int *stringRemap;
	int *transitions;
	void **transdata;
	xmlChar **stringMap;
        xmlChar *value;

	/*
	 * Switch to a compact representation
	 * 1/ counting the effective number of states left
	 * 2/ counting the unique number of atoms, and check that
	 *    they are all of the string type
	 * 3/ build a table state x atom for the transitions
	 */

	stateRemap = xmlMalloc(ret->nbStates * sizeof(int));
	if (stateRemap == NULL) {
	    xmlRegexpErrMemory(ctxt, "compiling regexp");
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbStates;i++) {
	    if (ret->states[i] != NULL) {
		stateRemap[i] = nbstates;
		nbstates++;
	    } else {
		stateRemap[i] = -1;
	    }
	}
#ifdef DEBUG_COMPACTION
	printf("Final: %d states\n", nbstates);
#endif
	stringMap = xmlMalloc(ret->nbAtoms * sizeof(char *));
	if (stringMap == NULL) {
	    xmlRegexpErrMemory(ctxt, "compiling regexp");
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	stringRemap = xmlMalloc(ret->nbAtoms * sizeof(int));
	if (stringRemap == NULL) {
	    xmlRegexpErrMemory(ctxt, "compiling regexp");
	    xmlFree(stringMap);
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbAtoms;i++) {
	    if ((ret->atoms[i]->type == XML_REGEXP_STRING) &&
		(ret->atoms[i]->quant == XML_REGEXP_QUANT_ONCE)) {
		value = ret->atoms[i]->valuep;
                for (j = 0;j < nbatoms;j++) {
		    if (xmlStrEqual(stringMap[j], value)) {
			stringRemap[i] = j;
			break;
		    }
		}
		if (j >= nbatoms) {
		    stringRemap[i] = nbatoms;
		    stringMap[nbatoms] = xmlStrdup(value);
		    if (stringMap[nbatoms] == NULL) {
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringRemap);
			xmlFree(stringMap);
			xmlFree(stateRemap);
			xmlFree(ret);
			return(NULL);
		    }
		    nbatoms++;
		}
	    } else {
		xmlFree(stateRemap);
		xmlFree(stringRemap);
		for (i = 0;i < nbatoms;i++)
		    xmlFree(stringMap[i]);
		xmlFree(stringMap);
		xmlFree(ret);
		return(NULL);
	    }
	}
#ifdef DEBUG_COMPACTION
	printf("Final: %d atoms\n", nbatoms);
#endif
	transitions = (int *) xmlRegCalloc2(nbstates + 1, nbatoms + 1,
                                            sizeof(int));
	if (transitions == NULL) {
	    xmlFree(stateRemap);
	    xmlFree(stringRemap);
            for (i = 0;i < nbatoms;i++)
		xmlFree(stringMap[i]);
	    xmlFree(stringMap);
	    xmlFree(ret);
	    return(NULL);
	}

	/*
	 * Allocate the transition table. The first entry for each
	 * state corresponds to the state type.
	 */
	transdata = NULL;

	for (i = 0;i < ret->nbStates;i++) {
	    int stateno, atomno, targetno, prev;
	    xmlRegStatePtr state;
	    xmlRegTransPtr trans;

	    stateno = stateRemap[i];
	    if (stateno == -1)
		continue;
	    state = ret->states[i];

	    transitions[stateno * (nbatoms + 1)] = state->type;

	    for (j = 0;j < state->nbTrans;j++) {
		trans = &(state->trans[j]);
		if ((trans->to == -1) || (trans->atom == NULL))
		    continue;
                atomno = stringRemap[trans->atom->no];
		if ((trans->atom->data != NULL) && (transdata == NULL)) {
		    transdata = (void **) xmlRegCalloc2(nbstates, nbatoms,
			                                sizeof(void *));
		    if (transdata == NULL) {
			xmlRegexpErrMemory(ctxt, "compiling regexp");
			break;
		    }
		}
		targetno = stateRemap[trans->to];
		/*
		 * if the same atom can generate transitions to 2 different
		 * states then it means the automata is not deterministic and
		 * the compact form can't be used !
		 */
		prev = transitions[stateno * (nbatoms + 1) + atomno + 1];
		if (prev != 0) {
		    if (prev != targetno + 1) {
			ret->determinist = 0;
#ifdef DEBUG_COMPACTION
			printf("Indet: state %d trans %d, atom %d to %d : %d to %d\n",
			       i, j, trans->atom->no, trans->to, atomno, targetno);
			printf("       previous to is %d\n", prev);
#endif
			if (transdata != NULL)
			    xmlFree(transdata);
			xmlFree(transitions);
			xmlFree(stateRemap);
			xmlFree(stringRemap);
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringMap);
			goto not_determ;
		    }
		} else {
#if 0
		    printf("State %d trans %d: atom %d to %d : %d to %d\n",
			   i, j, trans->atom->no, trans->to, atomno, targetno);
#endif
		    transitions[stateno * (nbatoms + 1) + atomno + 1] =
			targetno + 1; /* to avoid 0 */
		    if (transdata != NULL)
			transdata[stateno * nbatoms + atomno] =
			    trans->atom->data;
		}
	    }
	}
	ret->determinist = 1;
#ifdef DEBUG_COMPACTION
	/*
	 * Debug
	 */
	for (i = 0;i < nbstates;i++) {
	    for (j = 0;j < nbatoms + 1;j++) {
                printf("%02d ", transitions[i * (nbatoms + 1) + j]);
	    }
	    printf("\n");
	}
	printf("\n");
#endif
	/*
	 * Cleanup of the old data
	 */
	if (ret->states != NULL) {
	    for (i = 0;i < ret->nbStates;i++)
		xmlRegFreeState(ret->states[i]);
	    xmlFree(ret->states);
	}
	ret->states = NULL;
	ret->nbStates = 0;
	if (ret->atoms != NULL) {
	    for (i = 0;i < ret->nbAtoms;i++)
		xmlRegFreeAtom(ret->atoms[i]);
	    xmlFree(ret->atoms);
	}
	ret->atoms = NULL;
	ret->nbAtoms = 0;

	ret->compact = transitions;
	ret->transdata = transdata;
	ret->stringMap = stringMap;
	ret->nbstrings = nbatoms;
	ret->nbstates = nbstates;
	xmlFree(stateRemap);
	xmlFree(stringRemap);
    }
not_determ:
    ctxt->string = NULL;
    ctxt->nbStates = 0;
    ctxt->states = NULL;
    ctxt->nbAtoms = 0;
    ctxt->atoms = NULL;
    ctxt->nbCounters = 0;
    ctxt->counters = NULL;
    return(ret);
}